

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::projectQuad(OpenGLRenderer *this,vec2 a,vec2 b,vec2 *v)

{
  mat4 *this_00;
  mat4 *this_01;
  vec2 v_00;
  vec2 v_01;
  vec2 v_02;
  vec2 vVar1;
  float fVar2;
  vec3 vVar3;
  vec3 v_03;
  vec3 v_04;
  vec3 v_05;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  this_00 = &this->m_m2d;
  this_01 = &this->m_m3d;
  vVar3.z = 0.0;
  vVar3._0_8_ = a;
  vVar3 = mat4::operator*(this_01,vVar3);
  fVar2 = (this->m_farPlane - vVar3.z) / this->m_farPlane;
  vVar1.y = vVar3.y / fVar2;
  vVar1.x = vVar3.x / fVar2;
  vVar1 = mat4::operator*(this_00,vVar1);
  *v = vVar1;
  fStack_34 = b.y;
  local_48 = a.x;
  v_03.y = fStack_34;
  v_03.x = local_48;
  v_03.z = 0.0;
  vVar3 = mat4::operator*(this_01,v_03);
  fVar2 = (this->m_farPlane - vVar3.z) / this->m_farPlane;
  v_00.y = vVar3.y / fVar2;
  v_00.x = vVar3.x / fVar2;
  vVar1 = mat4::operator*(this_00,v_00);
  v[1] = vVar1;
  local_38 = b.x;
  fStack_44 = a.y;
  v_04.y = fStack_44;
  v_04.x = local_38;
  v_04.z = 0.0;
  vVar3 = mat4::operator*(this_01,v_04);
  fVar2 = (this->m_farPlane - vVar3.z) / this->m_farPlane;
  v_01.y = vVar3.y / fVar2;
  v_01.x = vVar3.x / fVar2;
  vVar1 = mat4::operator*(this_00,v_01);
  v[2] = vVar1;
  v_05.z = 0.0;
  v_05._0_8_ = b;
  vVar3 = mat4::operator*(this_01,v_05);
  fVar2 = (this->m_farPlane - vVar3.z) / this->m_farPlane;
  v_02.y = vVar3.y / fVar2;
  v_02.x = vVar3.x / fVar2;
  vVar1 = mat4::operator*(this_00,v_02);
  v[3] = vVar1;
  return;
}

Assistant:

inline void OpenGLRenderer::projectQuad(vec2 a, vec2 b, vec2 *v)
{
    // The steps involved in each line is as follows.:
    // pt_3d = matrix3D * pt                 // apply the 3D transform
    // pt_proj = pt_3d.project2D()           // project it to 2D based on current farPlane
    // pt_screen = parent_matrix * pt_proj   // Put the output of our local 3D into the scene world coordinate system
    v[0] = m_m2d * ((m_m3d * vec3(a))       .project2D(m_farPlane));    // top left
    v[1] = m_m2d * ((m_m3d * vec3(a.x, b.y)).project2D(m_farPlane));    // bottom left
    v[2] = m_m2d * ((m_m3d * vec3(b.x, a.y)).project2D(m_farPlane));    // top right
    v[3] = m_m2d * ((m_m3d * vec3(b))       .project2D(m_farPlane));    // bottom right
}